

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O3

bool Assimp::IFC::IsTrue(BOOLEAN *in)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = (in->super_STRING).val._M_dataplus._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + (in->super_STRING).val._M_string_length);
  iVar2 = std::__cxx11::string::compare((char *)local_60);
  if (iVar2 == 0) {
    bVar3 = true;
  }
  else {
    pcVar1 = (in->super_STRING).val._M_dataplus._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar1,pcVar1 + (in->super_STRING).val._M_string_length);
    iVar2 = std::__cxx11::string::compare((char *)local_40);
    bVar3 = iVar2 == 0;
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return bVar3;
}

Assistant:

bool IsTrue(const ::Assimp::STEP::EXPRESS::BOOLEAN& in)
{
    return (std::string)in == "TRUE" || (std::string)in == "T";
}